

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O0

bool slang::ast::FmtHelpers::checkSFormatArgs(ASTContext *context,Args *args)

{
  SourceRange sourceRange;
  bool bVar1;
  reference ppEVar2;
  iterator iVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDI;
  Expression *arg;
  iterator argIt;
  iterator in_stack_00000070;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffff88;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar4;
  DiagCode code;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_30;
  Expression *local_28;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_20 [2];
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_10;
  bool local_1;
  
  local_10 = in_RDI;
  local_20[0]._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff88);
  local_30 = __gnu_cxx::
             __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
             ::operator++(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20))
  ;
  ppEVar2 = __gnu_cxx::
            __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
            ::operator*(&local_30);
  local_28 = *ppEVar2;
  if (local_28->kind == StringLiteral) {
    Expression::as<slang::ast::StringLiteral>(local_28);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end(local_10);
    bVar1 = checkFormatString(context,(StringLiteral *)args,(iterator *)argIt._M_current,
                              in_stack_00000070);
    if (bVar1) {
      iVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end(local_10);
      code = SUB84((ulong)iVar3._M_current >> 0x20,0);
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        (in_stack_ffffffffffffff90,
                         (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffff88);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_1 = true;
      }
      else {
        uVar4 = 0x16000b;
        ppEVar2 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                  ::operator*(local_20);
        sourceRange.endLoc._0_4_ = in_stack_ffffffffffffffb8;
        sourceRange.startLoc = ((*ppEVar2)->sourceRange).endLoc;
        sourceRange.endLoc._4_4_ = uVar4;
        ASTContext::addDiag((ASTContext *)((*ppEVar2)->sourceRange).startLoc,code,sourceRange);
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool FmtHelpers::checkSFormatArgs(const ASTContext& context, const Args& args) {
    // If the format string is known at compile time, check it for correctness now.
    // Otherwise this will wait until runtime.
    auto argIt = args.begin();
    auto arg = *argIt++;
    if (arg->kind != ExpressionKind::StringLiteral)
        return true;

    if (!checkFormatString(context, arg->as<StringLiteral>(), argIt, args.end()))
        return false;

    // Leftover arguments are invalid (all must be consumed by the format string).
    if (argIt != args.end()) {
        context.addDiag(diag::FormatTooManyArgs, (*argIt)->sourceRange);
        return false;
    }

    return true;
}